

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O3

ssize_t __thiscall QIODevice::write(QIODevice *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  QObjectData *pQVar2;
  QRingBuffer *this_00;
  long lVar3;
  int iVar4;
  void *pvVar5;
  char *what;
  char cVar6;
  undefined4 in_register_00000034;
  void *__ptr;
  undefined1 auVar7 [16];
  int extraout_var;
  
  pQVar2 = (this->super_QObject).d_ptr.d;
  uVar1 = *(uint *)&pQVar2[4].bindingStorage.d;
  if ((uVar1 & 2) == 0) {
    if (uVar1 == 0) {
      what = "device not open";
    }
    else {
      what = "ReadOnly device";
    }
  }
  else {
    if (-1 < (long)__buf) {
      cVar6 = *(char *)((long)&pQVar2[4].bindingStorage.d + 6);
      if (cVar6 == '\0') {
        iVar4 = (*pQVar2->q_ptr->_vptr_QObject[0xc])();
        cVar6 = '\x02' - (char)iVar4;
        *(char *)((long)&pQVar2[4].bindingStorage.d + 6) = cVar6;
      }
      if (((cVar6 != '\x01') && (pQVar2[1].children.d.size != *(long *)&pQVar2[1].field_0x30)) &&
         (iVar4 = (*(this->super_QObject)._vptr_QObject[0x11])(this), (char)iVar4 == '\0')) {
        return -1;
      }
      iVar4 = (*(this->super_QObject)._vptr_QObject[0x1c])
                        (this,CONCAT44(in_register_00000034,__fd),__buf);
      pvVar5 = (void *)CONCAT44(extraout_var,iVar4);
      if ((pvVar5 == (void *)0x0 || extraout_var < 0) || cVar6 == '\x01') {
        return (ssize_t)pvVar5;
      }
      lVar3 = *(long *)&pQVar2[1].field_0x30;
      auVar7._0_8_ = CONCAT44(extraout_var,iVar4);
      auVar7._8_4_ = iVar4;
      auVar7._12_4_ = extraout_var;
      pQVar2[1].children.d.size = auVar7._0_8_ + pQVar2[1].children.d.size;
      *(long *)&pQVar2[1].field_0x30 = auVar7._8_8_ + lVar3;
      this_00 = (QRingBuffer *)pQVar2[1].bindingStorage.d;
      if (this_00 == (QRingBuffer *)0x0) {
        return (ssize_t)pvVar5;
      }
      __ptr = pvVar5;
      if ((long)this_00->bufferSize < (long)pvVar5) {
        __ptr = (void *)this_00->bufferSize;
      }
      QRingBuffer::free(this_00,__ptr);
      return (ssize_t)pvVar5;
    }
    what = "Called with maxSize < 0";
  }
  checkWarnMessage(this,"write",what);
  return -1;
}

Assistant:

qint64 QIODevice::write(const char *data, qint64 maxSize)
{
    Q_D(QIODevice);
    CHECK_WRITABLE(write, qint64(-1));
    CHECK_MAXLEN(write, qint64(-1));

    const bool sequential = d->isSequential();
    // Make sure the device is positioned correctly.
    if (d->pos != d->devicePos && !sequential && !seek(d->pos))
        return qint64(-1);

#ifdef Q_OS_WIN
    if (d->openMode & Text) {
        const char *endOfData = data + maxSize;
        const char *startOfBlock = data;

        qint64 writtenSoFar = 0;
        const qint64 savedPos = d->pos;

        forever {
            const char *endOfBlock = startOfBlock;
            while (endOfBlock < endOfData && *endOfBlock != '\n')
                ++endOfBlock;

            qint64 blockSize = endOfBlock - startOfBlock;
            if (blockSize > 0) {
                qint64 ret = writeData(startOfBlock, blockSize);
                if (ret <= 0) {
                    if (writtenSoFar && !sequential)
                        d->buffer.skip(d->pos - savedPos);
                    return writtenSoFar ? writtenSoFar : ret;
                }
                if (!sequential) {
                    d->pos += ret;
                    d->devicePos += ret;
                }
                writtenSoFar += ret;
            }

            if (endOfBlock == endOfData)
                break;

            qint64 ret = writeData("\r\n", 2);
            if (ret <= 0) {
                if (writtenSoFar && !sequential)
                    d->buffer.skip(d->pos - savedPos);
                return writtenSoFar ? writtenSoFar : ret;
            }
            if (!sequential) {
                d->pos += ret;
                d->devicePos += ret;
            }
            ++writtenSoFar;

            startOfBlock = endOfBlock + 1;
        }

        if (writtenSoFar && !sequential)
            d->buffer.skip(d->pos - savedPos);
        return writtenSoFar;
    }
#endif

    qint64 written = writeData(data, maxSize);
    if (!sequential && written > 0) {
        d->pos += written;
        d->devicePos += written;
        d->buffer.skip(written);
    }
    return written;
}